

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sandbox.cpp
# Opt level: O0

void __thiscall
Sandbox::replayPoke(Sandbox *this,AccessType type,u32 addr,u64 cycle,u32 fc,u16 value)

{
  InstrInfo IVar1;
  int local_4c;
  int i;
  int local_40;
  Instr local_34;
  InstrInfo info;
  u16 value_local;
  u32 fc_local;
  u64 cycle_local;
  u32 addr_local;
  AccessType type_local;
  Sandbox *this_local;
  
  if ((this->enabled & 1U) != 0) {
    IVar1 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,::opcode);
    local_40 = IVar1.S;
    local_34 = IVar1.I;
    if (((local_34 != CLR) || (local_40 != 4)) && ((local_34 != CHK || (cpuModel == M68000)))) {
      for (local_4c = 0; local_4c < this->recordCnt; local_4c = local_4c + 1) {
        if ((((local_4c == this->replayCnt) && (this->access[local_4c].type == type)) &&
            (this->access[local_4c].addr == addr)) &&
           ((this->access[local_4c].value == value && (this->access[local_4c].fc == fc)))) {
          this->replayCnt = this->replayCnt + 1;
          if (this->replayCnt <= this->recordCnt) {
            return;
          }
          break;
        }
      }
      error(this,type,addr,cycle,fc,value);
    }
  }
  return;
}

Assistant:

void
Sandbox::replayPoke(AccessType type, u32 addr, u64 cycle, u32 fc, u16 value)
{
    if (!enabled) return;

    auto info = moiracpu->getInstrInfo(opcode);

    // Ignore some opcodes that are handled differently by Moira
    if (info.I == Instr::CLR && info.S == Long) return;
    if (info.I == Instr::CHK && cpuModel != Model::M68000) return;

    for (int i = 0; i < recordCnt; i++) {

        // Enable for strict checking
        if (i != replayCnt) continue;

        // Check for a matching entry
        if (access[i].type != type) continue;
        if (access[i].addr != addr) continue;
        if (access[i].value != value) continue;
        if (access[i].fc != fc) continue;
        if (!MOIRA_MIMIC_MUSASHI) {
            if (access[i].cycle != cycle) continue;
        }

        // Match found
        replayCnt++;
        if (replayCnt > recordCnt) { break; }
        return;
    }

    error(type, addr, cycle, fc, value);
}